

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticpyramid.cpp
# Opt level: O1

void pzgeom::TPZQuadraticPyramid::GradX<double>
               (TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZFMatrix<double> *gradx)

{
  long lVar1;
  int j;
  long lVar2;
  int i;
  long lVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  TPZFNMatrix<39,_double> dphi;
  TPZFNMatrix<13,_double> phi;
  TPZFMatrix<double> local_300;
  double local_270 [40];
  TPZFMatrix<double> local_130;
  double local_a0 [14];
  
  (*(gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (gradx,3,3);
  (*(gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (gradx);
  local_130.fElem = local_a0;
  local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0xd;
  local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018da5e8;
  local_130.fSize = 0xd;
  local_130.fGiven = local_130.fElem;
  TPZVec<int>::TPZVec(&local_130.fPivot.super_TPZVec<int>,0);
  local_130.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_130.fPivot.super_TPZVec<int>.fStore = local_130.fPivot.fExtAlloc;
  local_130.fPivot.super_TPZVec<int>.fNElements = 0;
  local_130.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_130.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_130.fWork.fStore = (double *)0x0;
  local_130.fWork.fNElements = 0;
  local_130.fWork.fNAlloc = 0;
  local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018da2f8;
  local_300.fElem = local_270;
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0xd;
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018dafa8;
  local_300.fSize = 0x27;
  local_300.fGiven = local_300.fElem;
  TPZVec<int>::TPZVec(&local_300.fPivot.super_TPZVec<int>,0);
  local_300.fPivot.super_TPZVec<int>.fStore = local_300.fPivot.fExtAlloc;
  local_300.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_300.fPivot.super_TPZVec<int>.fNElements = 0;
  local_300.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_300.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_300.fWork.fStore = (double *)0x0;
  local_300.fWork.fNElements = 0;
  local_300.fWork.fNAlloc = 0;
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018dacb8;
  TShape<double>(loc,&local_130,&local_300);
  lVar3 = 0;
  do {
    lVar2 = 0;
    do {
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,lVar2,lVar3);
      if ((local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
         (local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2) ||
         ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      gradx->fElem[lVar2] =
           extraout_XMM0_Qa *
           local_300.fElem[local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar3] +
           gradx->fElem[lVar2];
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,lVar2,lVar3);
      if ((local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
         (local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2) ||
         ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      gradx->fElem[lVar1 + lVar2] =
           extraout_XMM0_Qa_00 *
           local_300.fElem[local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar3 + 1] +
           gradx->fElem[lVar1 + lVar2];
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,lVar2,lVar3);
      if ((local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 3) ||
         (local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2) ||
         ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      gradx->fElem[lVar1 * 2 + lVar2] =
           extraout_XMM0_Qa_01 *
           local_300.fElem[local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar3 + 2] +
           gradx->fElem[lVar1 * 2 + lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    lVar3 = lVar3 + 1;
    if (lVar3 == 0xd) {
      TPZFMatrix<double>::~TPZFMatrix(&local_300,&PTR_PTR_018daf70);
      TPZFMatrix<double>::~TPZFMatrix(&local_130,&PTR_PTR_018da5b0);
      return;
    }
  } while( true );
}

Assistant:

void TPZQuadraticPyramid::GradX(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc, TPZFMatrix<T> &gradx){
    
    gradx.Resize(3,3);
    gradx.Zero();
    int nrow = nodes.Rows();
    int ncol = nodes.Cols();
#ifdef PZDEBUG
    if(nrow != 3 || ncol  != 13){
        std::cout << "Objects of incompatible lengths, gradient cannot be computed." << std::endl;
        std::cout << "nodes matrix must be 3x13." << std::endl;
        DebugStop();
    }
    
#endif
    TPZFNMatrix<13,T> phi(NNodes,1);
    TPZFNMatrix<39,T> dphi(3,NNodes);
    TShape(loc,phi,dphi);
    for(int i = 0; i < NNodes; i++)
    {
        for(int j = 0; j < 3; j++)
        {
            gradx(j,0) += nodes.GetVal(j,i)*dphi(0,i);
            gradx(j,1) += nodes.GetVal(j,i)*dphi(1,i);
            gradx(j,2) += nodes.GetVal(j,i)*dphi(2,i);
            
        }
    }
    
}